

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

QPDFObjectHandle __thiscall
QPDFObjectHandle::newReal
          (QPDFObjectHandle *this,double value,int decimal_places,bool trim_trailing_zeroes)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar1;
  undefined1 local_30 [20];
  int local_1c;
  bool trim_trailing_zeroes_local;
  undefined8 uStack_18;
  int decimal_places_local;
  double value_local;
  
  local_30[0x13] = trim_trailing_zeroes;
  local_1c = decimal_places;
  uStack_18 = value;
  value_local = (double)this;
  QPDFObject::create<QPDF_Real,double&,int&,bool&>
            ((QPDFObject *)local_30,(double *)&stack0xffffffffffffffe8,&local_1c,
             (bool *)(local_30 + 0x13));
  QPDFObjectHandle(this,(shared_ptr<QPDFObject> *)local_30);
  std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)local_30);
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFObjectHandle::newReal(double value, int decimal_places, bool trim_trailing_zeroes)
{
    return {QPDFObject::create<QPDF_Real>(value, decimal_places, trim_trailing_zeroes)};
}